

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cc
# Opt level: O1

unique_ptr<flow::lang::Stmt,_std::default_delete<flow::lang::Stmt>_> __thiscall
flow::lang::Parser::postscriptStmt
          (Parser *this,
          unique_ptr<flow::lang::Stmt,_std::default_delete<flow::lang::Stmt>_> *baseStmt)

{
  int iVar1;
  Stmt *pSVar2;
  long lVar3;
  size_type sVar4;
  undefined8 uVar5;
  _Base_ptr p_Var6;
  bool bVar7;
  Opcode OVar8;
  LiteralType args;
  _Base_ptr __dest;
  Expr *pEVar9;
  undefined8 *puVar10;
  Parser *pPVar11;
  undefined8 *in_RDX;
  SourceLocation sloc;
  size_type __dnew;
  Expr *local_b0;
  Opcode local_a2;
  undefined1 local_a0 [32];
  _Head_base<0UL,_flow::lang::Lexer_*,_false> local_80;
  SymbolTable *local_78;
  Runtime *local_70 [3];
  undefined4 uStack_58;
  undefined4 uStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  Stmt *local_48;
  Stmt *local_40;
  _Base_ptr local_38;
  
  pSVar2 = baseStmt[6]._M_t.
           super___uniq_ptr_impl<flow::lang::Stmt,_std::default_delete<flow::lang::Stmt>_>._M_t.
           super__Tuple_impl<0UL,_flow::lang::Stmt_*,_std::default_delete<flow::lang::Stmt>_>.
           super__Head_base<0UL,_flow::lang::Stmt_*,_false>._M_head_impl;
  iVar1 = *(int *)((long)&pSVar2[2].super_ASTNode.location_.filename.field_2 + 8);
  if ((iVar1 != 0x3a) && (iVar1 != 0x3d)) {
    *(undefined8 *)&(this->features_)._M_t._M_impl = *in_RDX;
    *in_RDX = 0;
    return (__uniq_ptr_data<flow::lang::Stmt,_std::default_delete<flow::lang::Stmt>,_true,_true>)
           (__uniq_ptr_data<flow::lang::Stmt,_std::default_delete<flow::lang::Stmt>,_true,_true>)
           this;
  }
  local_80._M_head_impl = (Lexer *)local_70;
  lVar3 = *(long *)&pSVar2[1].super_ASTNode.location_.begin;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_80,lVar3,
             *(long *)&pSVar2[1].super_ASTNode.location_.begin.offset + lVar3);
  sVar4 = pSVar2[2].super_ASTNode.location_.filename.field_2._M_allocated_capacity;
  uStack_50 = (undefined4)sVar4;
  uStack_4c = (undefined4)(sVar4 >> 0x20);
  local_70[2] = *(Runtime **)&pSVar2[2].super_ASTNode.location_.filename._M_dataplus;
  sVar4 = pSVar2[2].super_ASTNode.location_.filename._M_string_length;
  uStack_58 = (undefined4)sVar4;
  uStack_54 = (undefined4)(sVar4 >> 0x20);
  Lexer::nextToken((Lexer *)baseStmt[6]._M_t.
                            super___uniq_ptr_impl<flow::lang::Stmt,_std::default_delete<flow::lang::Stmt>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_flow::lang::Stmt_*,_std::default_delete<flow::lang::Stmt>_>
                            .super__Head_base<0UL,_flow::lang::Stmt_*,_false>._M_head_impl);
  logicExpr((Parser *)&local_b0);
  pEVar9 = local_b0;
  if (local_b0 == (Expr *)0x0) {
LAB_0012c208:
    puVar10 = (undefined8 *)0x0;
    pPVar11 = this;
  }
  else {
    if (iVar1 == 0x3d) {
      OVar8 = makeOperator(Not,local_b0);
      if (OVar8 == EXIT) {
        local_40 = baseStmt[6]._M_t.
                   super___uniq_ptr_impl<flow::lang::Stmt,_std::default_delete<flow::lang::Stmt>_>.
                   _M_t.
                   super__Tuple_impl<0UL,_flow::lang::Stmt_*,_std::default_delete<flow::lang::Stmt>_>
                   .super__Head_base<0UL,_flow::lang::Stmt_*,_false>._M_head_impl;
        local_48 = baseStmt[0xd]._M_t.
                   super___uniq_ptr_impl<flow::lang::Stmt,_std::default_delete<flow::lang::Stmt>_>.
                   _M_t.
                   super__Tuple_impl<0UL,_flow::lang::Stmt_*,_std::default_delete<flow::lang::Stmt>_>
                   .super__Head_base<0UL,_flow::lang::Stmt_*,_false>._M_head_impl;
        local_a0._0_8_ = local_a0 + 0x10;
        local_38 = (_Base_ptr)0x4f;
        local_a2 = OVar8;
        __dest = (_Base_ptr)std::__cxx11::string::_M_create((ulong *)local_a0,(ulong)&local_38);
        p_Var6 = local_38;
        local_a0._16_8_ = local_38;
        local_a0._0_8_ = __dest;
        memcpy(__dest,
               "Type cast error. No cast implementation found for requested cast from {} to {}.",
               0x4f);
        local_a0._8_8_ = p_Var6;
        *(undefined1 *)((long)&__dest->_M_color + (long)p_Var6) = 0;
        args = (*(pEVar9->super_ASTNode)._vptr_ASTNode[3])(pEVar9);
        diagnostics::Report::typeError<flow::LiteralType,flow::LiteralType>
                  ((Report *)local_48,
                   (SourceLocation *)&(local_40->super_ASTNode).location_.begin.offset,
                   (string *)local_a0,args,Boolean);
        OVar8 = local_a2;
        if ((_Base_ptr)local_a0._0_8_ != (_Base_ptr)(local_a0 + 0x10)) {
          operator_delete((void *)local_a0._0_8_,(ulong)(local_a0._16_8_ + 1));
        }
        *(undefined8 *)&(this->features_)._M_t._M_impl = 0;
      }
      else {
        pEVar9 = (Expr *)operator_new(0x50);
        (pEVar9->super_ASTNode)._vptr_ASTNode = (_func_int **)&PTR__ASTNode_0019d690;
        (pEVar9->super_ASTNode).location_.filename._M_dataplus._M_p =
             (pointer)&(pEVar9->super_ASTNode).location_.filename.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&(pEVar9->super_ASTNode).location_,local_80._M_head_impl,
                   (long)&(local_78->symbols_).
                          super__Vector_base<std::unique_ptr<flow::lang::Symbol,_std::default_delete<flow::lang::Symbol>_>,_std::allocator<std::unique_ptr<flow::lang::Symbol,_std::default_delete<flow::lang::Symbol>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start + (long)local_80._M_head_impl);
        (pEVar9->super_ASTNode).location_.end.column = uStack_50;
        (pEVar9->super_ASTNode).location_.end.offset = uStack_4c;
        *(Runtime **)&(pEVar9->super_ASTNode).location_.begin = local_70[2];
        *(ulong *)&(pEVar9->super_ASTNode).location_.begin.offset = CONCAT44(uStack_54,uStack_58);
        (pEVar9->super_ASTNode)._vptr_ASTNode = (_func_int **)&PTR__UnaryExpr_0019da28;
        *(Opcode *)&pEVar9[1].super_ASTNode._vptr_ASTNode = OVar8;
        pEVar9[1].super_ASTNode.location_.filename._M_dataplus._M_p = (pointer)local_b0;
        local_b0 = pEVar9;
      }
      if (OVar8 == EXIT) goto LAB_0012c218;
    }
    bVar7 = expect((Parser *)baseStmt,Semicolon);
    if ((!bVar7) ||
       (Lexer::nextToken((Lexer *)baseStmt[6]._M_t.
                                  super___uniq_ptr_impl<flow::lang::Stmt,_std::default_delete<flow::lang::Stmt>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_flow::lang::Stmt_*,_std::default_delete<flow::lang::Stmt>_>
                                  .super__Head_base<0UL,_flow::lang::Stmt_*,_false>._M_head_impl),
       !bVar7)) goto LAB_0012c208;
    pSVar2 = baseStmt[6]._M_t.
             super___uniq_ptr_impl<flow::lang::Stmt,_std::default_delete<flow::lang::Stmt>_>._M_t.
             super__Tuple_impl<0UL,_flow::lang::Stmt_*,_std::default_delete<flow::lang::Stmt>_>.
             super__Head_base<0UL,_flow::lang::Stmt_*,_false>._M_head_impl;
    uStack_4c = *(undefined4 *)((long)&pSVar2[1].super_ASTNode.location_.filename.field_2 + 0xc);
    uVar5 = *(undefined8 *)((long)&pSVar2[1].super_ASTNode.location_.filename.field_2 + 4);
    uStack_54 = (undefined4)uVar5;
    uStack_50 = (undefined4)((ulong)uVar5 >> 0x20);
    puVar10 = (undefined8 *)operator_new(0x58);
    pEVar9 = local_b0;
    local_b0 = (Expr *)0x0;
    uVar5 = *in_RDX;
    *in_RDX = 0;
    *puVar10 = &PTR__ASTNode_0019d690;
    puVar10[1] = puVar10 + 3;
    std::__cxx11::string::_M_construct<char*>
              ((string *)(puVar10 + 1),local_80._M_head_impl,
               (long)&(local_78->symbols_).
                      super__Vector_base<std::unique_ptr<flow::lang::Symbol,_std::default_delete<flow::lang::Symbol>_>,_std::allocator<std::unique_ptr<flow::lang::Symbol,_std::default_delete<flow::lang::Symbol>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start + (long)local_80._M_head_impl);
    puVar10[7] = CONCAT44(uStack_4c,uStack_50);
    puVar10[5] = local_70[2];
    puVar10[6] = CONCAT44(uStack_54,uStack_58);
    *puVar10 = &PTR__CondStmt_0019dc50;
    puVar10[8] = pEVar9;
    puVar10[9] = uVar5;
    pPVar11 = (Parser *)(puVar10 + 10);
  }
  *(undefined8 *)&(pPVar11->features_)._M_t._M_impl = 0;
  *(undefined8 **)&(this->features_)._M_t._M_impl = puVar10;
LAB_0012c218:
  if (local_b0 != (Expr *)0x0) {
    (*(local_b0->super_ASTNode)._vptr_ASTNode[1])();
  }
  if (local_80._M_head_impl != (Lexer *)local_70) {
    operator_delete(local_80._M_head_impl,(ulong)((long)&local_70[0]->_vptr_Runtime + 1));
  }
  return (__uniq_ptr_data<flow::lang::Stmt,_std::default_delete<flow::lang::Stmt>,_true,_true>)
         (__uniq_ptr_data<flow::lang::Stmt,_std::default_delete<flow::lang::Stmt>,_true,_true>)this;
}

Assistant:

std::unique_ptr<Stmt> Parser::postscriptStmt(
    std::unique_ptr<Stmt> baseStmt) {
  Token op = token();
  switch (op) {
    case Token::If:
    case Token::Unless:
      break;
    default:
      return baseStmt;
  }

  // STMT ['if' EXPR] ';'
  // STMT ['unless' EXPR] ';'

  SourceLocation sloc = location();

  nextToken();  // 'if' | 'unless'

  std::unique_ptr<Expr> condExpr = expr();
  if (!condExpr) return nullptr;

  if (op == Token::Unless) {
    auto opc = makeOperator(Token::Not, condExpr.get());
    if (opc == Opcode::EXIT) {
      report_.typeError(
          lastLocation(),
          "Type cast error. No cast implementation found for requested cast "
          "from {} to {}.",
          condExpr->getType(), LiteralType::Boolean);
      return nullptr;
    }

    condExpr = std::make_unique<UnaryExpr>(opc, std::move(condExpr), sloc);
  }

  if (!consume(Token::Semicolon)) return nullptr;

  return std::make_unique<CondStmt>(std::move(condExpr), std::move(baseStmt),
                                    nullptr, sloc.update(end()));
}